

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

Bool prvTidytidySetLanguage(ctmbstr languageCode)

{
  int iVar1;
  ulong in_RAX;
  tmbstr ptVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  languageDefinition *plVar5;
  languageDefinition *plVar6;
  Bool BVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  tidyLocaleMapItemImpl *ptVar11;
  char lang [3];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xff000000ffffffff;
  if (languageCode == (ctmbstr)0x0) {
    BVar7 = no;
  }
  else {
    ptVar2 = prvTidytmbstrdup(&prvTidyg_default_allocator,languageCode);
    ptVar2 = prvTidytmbstrtolower(ptVar2);
    iVar1 = strcmp("america",ptVar2);
    if (iVar1 == 0) {
      ptVar11 = localeMappings;
    }
    else {
      uVar9 = 1;
      do {
        uVar10 = uVar9;
        if (localeMappings[uVar10].winName == (char *)0x0) goto LAB_00135def;
        iVar1 = strcmp(localeMappings[uVar10].winName,ptVar2);
        uVar9 = uVar10 + 1;
      } while (iVar1 != 0);
      ptVar11 = localeMappings + uVar10;
    }
    (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar2);
    ptVar2 = prvTidytmbstrdup(&prvTidyg_default_allocator,ptVar11->POSIXName);
LAB_00135def:
    sVar3 = strlen(ptVar2);
    uVar9 = (uint)sVar3;
    if (uVar9 != 0) {
      uVar10 = 5;
      if (uVar9 < 5) {
        uVar10 = uVar9;
      }
      uVar8 = 0;
      do {
        if (uVar8 == 2) {
          if (uVar9 < 5) {
            DAT_001f0e8a = 0;
            break;
          }
          DAT_001f0e8a = 0x5f;
        }
        else {
          pp_Var4 = __ctype_tolower_loc();
          (&prvTidytidyNormalizedLocaleName_result)[uVar8] = (char)(*pp_Var4)[ptVar2[uVar8]];
        }
        uVar8 = uVar8 + 1;
      } while (uVar10 + (uVar10 == 0) != uVar8);
    }
    (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar2);
    plVar5 = prvTidytidyTestLanguage(&prvTidytidyNormalizedLocaleName_result);
    sVar3 = strlen(&prvTidytidyNormalizedLocaleName_result);
    if (sVar3 < 3) {
      plVar6 = (languageDefinition *)0x0;
    }
    else {
      strncpy((char *)((long)&uStack_38 + 4),&prvTidytidyNormalizedLocaleName_result,2);
      uStack_38._0_7_ = (uint7)(uint6)uStack_38;
      plVar6 = prvTidytidyTestLanguage((char *)((long)&uStack_38 + 4));
    }
    if (plVar6 != (languageDefinition *)0x0 && plVar5 != (languageDefinition *)0x0) {
      tidyLanguages.currentLanguage = plVar5;
      tidyLanguages.fallbackLanguage = plVar6;
    }
    if (plVar5 != (languageDefinition *)0x0 && plVar6 == (languageDefinition *)0x0) {
      tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
      tidyLanguages.currentLanguage = plVar5;
    }
    if (plVar6 != (languageDefinition *)0x0 && plVar5 == (languageDefinition *)0x0) {
      tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
      tidyLanguages.currentLanguage = plVar6;
    }
    BVar7 = (Bool)(plVar5 != (languageDefinition *)0x0 || plVar6 != (languageDefinition *)0x0);
  }
  return BVar7;
}

Assistant:

TY_PRIVATE Bool TY_(tidySetLanguage)( ctmbstr languageCode )
{
    languageDefinition *dict1 = NULL;
    languageDefinition *dict2 = NULL;
    tmbstr wantCode = NULL;
    char lang[3] = "";
    
    if ( !languageCode || !(wantCode = TY_(tidyNormalizedLocaleName)( languageCode )) )
    {
        return no;
    }
    
    /* We want to use the specified language as the currentLanguage, and set
     fallback language as necessary. We have either a two or five digit code,
     either or both of which might be installed. Let's test both of them:
     */
    
    dict1 = TY_(tidyTestLanguage( wantCode ));  /* WANTED language */
    
    if ( strlen( wantCode ) > 2 )
    {
        strncpy(lang, wantCode, 2);
        lang[2] = '\0';
        dict2 = TY_(tidyTestLanguage( lang ) ); /* BACKUP language? */
    }
    
    if ( dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = dict2;
    }
    if ( dict1 && !dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict2;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && !dict2 )
    {
        /* No change. */
    }
    
    return dict1 || dict2;
}